

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O2

void __thiscall
cbtAlignedObjectArray<cbtFace>::cbtAlignedObjectArray
          (cbtAlignedObjectArray<cbtFace> *this,cbtAlignedObjectArray<cbtFace> *otherArray)

{
  uint newsize;
  cbtFace cStack_48;
  
  this->m_ownsMemory = true;
  this->m_data = (cbtFace *)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  newsize = otherArray->m_size;
  cStack_48.m_plane[0] = 0.0;
  cStack_48.m_plane[1] = 0.0;
  cStack_48.m_plane[2] = 0.0;
  cStack_48.m_plane[3] = 0.0;
  cStack_48.m_indices.m_capacity = 0;
  cStack_48.m_indices._12_4_ = 0;
  cStack_48.m_indices.m_data = (int *)0x0;
  cStack_48.m_indices.m_ownsMemory = true;
  cStack_48.m_indices._25_7_ = 0;
  cStack_48.m_indices._0_4_ = 0;
  cStack_48.m_indices.m_size = 0;
  resize(this,newsize,&cStack_48);
  cbtAlignedObjectArray<int>::~cbtAlignedObjectArray(&cStack_48.m_indices);
  copy(otherArray,(EVP_PKEY_CTX *)0x0,(EVP_PKEY_CTX *)(ulong)newsize);
  return;
}

Assistant:

cbtAlignedObjectArray(const cbtAlignedObjectArray& otherArray)
	{
		init();

		int otherSize = otherArray.size();
		resize(otherSize);
		otherArray.copy(0, otherSize, m_data);
	}